

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.c
# Opt level: O0

_Bool clone_bytes(uchar **dst,uchar *src,size_t len)

{
  _Bool _Var1;
  size_t len_local;
  uchar *src_local;
  uchar **dst_local;
  
  _Var1 = clone_data(dst,src,len);
  return _Var1;
}

Assistant:

bool clone_bytes(unsigned char **dst, const unsigned char *src, size_t len)
{
    return clone_data((void **)dst, src, len);
}